

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O0

void mtn_connect(chunk_conflict *c,loc grid1,loc grid2)

{
  _Bool _Var1;
  wchar_t wVar2;
  feature *pfVar3;
  wchar_t local_1030;
  wchar_t j;
  wchar_t path_grids;
  loc gp [512];
  chunk_conflict *c_local;
  loc grid2_local;
  loc grid1_local;
  
  wVar2 = project_path((chunk *)c,(loc_conflict *)&j,L'Ȁ',(loc_conflict)grid1,(loc_conflict)grid2,
                       L'耀');
  local_1030 = L'\0';
  while ((((local_1030 < wVar2 &&
           (_Var1 = square_in_bounds_fully((chunk *)c,*(loc_conflict *)(&j + (long)local_1030 * 2)),
           _Var1)) &&
          (pfVar3 = square_feat((chunk *)c,*(loc_conflict *)(&j + (long)local_1030 * 2)),
          pfVar3->fidx != FEAT_ROAD)) &&
         (_Var1 = square_ismark((chunk *)c,*(loc_conflict *)(&j + (long)local_1030 * 2)), !_Var1)))
  {
    square_set_feat((chunk *)c,*(loc_conflict *)(&j + (long)local_1030 * 2),FEAT_ROAD);
    square_mark((chunk *)c,*(loc_conflict *)(&j + (long)local_1030 * 2));
    local_1030 = local_1030 + L'\x01';
  }
  return;
}

Assistant:

static void mtn_connect(struct chunk *c, struct loc grid1, struct loc grid2)
{
	struct loc gp[512];
	int path_grids, j;

	/* Find the shortest path */
	path_grids = project_path(c, gp, 512, grid1, grid2, PROJECT_ROCK);

	/* Make the path */
	for (j = 0; j < path_grids; j++) {
		if (!square_in_bounds_fully(c, gp[j])
				|| square_feat(c, gp[j])->fidx == FEAT_ROAD
				|| square_ismark(c, gp[j]))
			break;
		square_set_feat(c, gp[j], FEAT_ROAD);
		square_mark(c, gp[j]);
	}
}